

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::EscapeKdoc_abi_cxx11_
          (string *__return_storage_ptr__,java *this,string_view input)

{
  java jVar1;
  string *psVar2;
  string *psVar3;
  java *pjVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar2 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (this != (java *)0x0) {
    pjVar4 = (java *)0x0;
    psVar3 = (string *)0x61;
    do {
      jVar1 = pjVar4[input._M_len];
      psVar2 = (string *)(ulong)(byte)jVar1;
      if (jVar1 == (java)0x2f) {
        if ((char)psVar3 != '*') goto LAB_00df1553;
LAB_00df153c:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if ((jVar1 == (java)0x2a) && ((char)psVar3 == '/')) goto LAB_00df153c;
LAB_00df1553:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pjVar4 = pjVar4 + 1;
      psVar3 = psVar2;
    } while (this != pjVar4);
  }
  return psVar2;
}

Assistant:

static std::string EscapeKdoc(absl::string_view input) {
  std::string result;
  result.reserve(input.size() * 2);

  char prev = 'a';

  for (char c : input) {
    switch (c) {
      case '*':
        // Avoid "/*".
        if (prev == '/') {
          result.append("&#42;");
        } else {
          result.push_back(c);
        }
        break;
      case '/':
        // Avoid "*/".
        if (prev == '*') {
          result.append("&#47;");
        } else {
          result.push_back(c);
        }
        break;
      default:
        result.push_back(c);
        break;
    }

    prev = c;
  }

  return result;
}